

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cc
# Opt level: O1

string * bssl::ReadTestFileToString(string *__return_storage_ptr__,string *file_path_ascii)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,"pki/",file_path_ascii);
  GetTestData_abi_cxx11_(__return_storage_ptr__,local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReadTestFileToString(const std::string &file_path_ascii) {
  return GetTestData(("pki/" + file_path_ascii).c_str());
}